

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnInitExprGetGlobalExpr
          (BinaryReaderIR *this,Index index,Index global_index)

{
  Var *this_00;
  intrusive_list<wabt::Expr> *this_01;
  undefined1 local_a0 [8];
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  Expr *local_30;
  
  GetLocation((Location *)local_a0,this);
  this_01 = this->current_init_expr_;
  this_00 = (Var *)((long)&loc.field_1 + 8);
  Var::Var(this_00,global_index,(Location *)local_a0);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)17>,wabt::Var,wabt::Location&>
            ((wabt *)&local_30,this_00,(Location *)local_a0);
  local_38._M_head_impl = local_30;
  local_30 = (Expr *)0x0;
  intrusive_list<wabt::Expr>::push_back
            (this_01,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  local_38._M_head_impl = (Expr *)0x0;
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  local_30 = (Expr *)0x0;
  Var::~Var((Var *)((long)&loc.field_1 + 8));
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprGetGlobalExpr(Index index,
                                               Index global_index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<GetGlobalExpr>(Var(global_index, loc), loc));
  return Result::Ok;
}